

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeDensity.cpp
# Opt level: O2

void __thiscall OpenMD::PipeDensity::writeDensity(PipeDensity *this)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  pointer pvVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ofstream rdfStream;
  
  std::ofstream::ofstream
            (&rdfStream,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    snprintf(painCave.errMsg,2000,"PipeDensity: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::operator<<((ostream *)&rdfStream,"#PipeDensity\n");
    poVar3 = std::operator<<((ostream *)&rdfStream,"#nFrames:\t");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->nProcessed_);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&rdfStream,"#selection: (");
    poVar3 = std::operator<<(poVar3,(string *)&this->selectionScript_);
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<((ostream *)&rdfStream,"#density (");
    poVar3 = std::operator<<(poVar3,(string *)&this->axisLabel1_);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = std::operator<<(poVar3,(string *)&this->axisLabel2_);
    std::operator<<(poVar3,")\n");
    uVar6 = 0;
    while( true ) {
      uVar7 = (ulong)uVar6;
      pvVar4 = (this->density_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->density_).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) <= uVar7
         ) break;
      uVar5 = 0;
      while( true ) {
        lVar1 = *(long *)&pvVar4[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar4[uVar7].super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data + 8) - lVar1 >> 3) <=
            (ulong)uVar5) break;
        std::ostream::_M_insert<double>
                  ((*(double *)(lVar1 + (ulong)uVar5 * 8) * 1.66053886) / (double)this->nProcessed_)
        ;
        std::operator<<((ostream *)&rdfStream,"\t");
        uVar5 = uVar5 + 1;
        pvVar4 = (this->density_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      std::operator<<((ostream *)&rdfStream,"\n");
      uVar6 = uVar6 + 1;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&rdfStream);
  return;
}

Assistant:

void PipeDensity::writeDensity() {
    std::ofstream rdfStream(outputFilename_.c_str());

    if (rdfStream.is_open()) {
      rdfStream << "#PipeDensity\n";
      rdfStream << "#nFrames:\t" << nProcessed_ << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "#density (" << axisLabel1_ << "," << axisLabel2_ << ")\n";
      for (unsigned int i = 0; i < density_.size(); ++i) {
        for (unsigned int j = 0; j < density_[i].size(); ++j) {
          rdfStream << Constants::densityConvert * density_[i][j] / nProcessed_;
          rdfStream << "\t";
        }
        rdfStream << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PipeDensity: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }